

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

bool __thiscall
wasm::analysis::Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_>::join
          (Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_> *this,Element *joinee,
          Element *joiner)

{
  bool bVar1;
  ulong uVar2;
  pointer pTVar3;
  ulong uVar4;
  long lVar5;
  pointer pTVar6;
  pointer pTVar7;
  bool bVar8;
  
  pTVar3 = (joiner->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(joiner->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar3 >> 3;
  pTVar6 = (joinee->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(joinee->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar6 >> 3;
  lVar5 = uVar4 - uVar2;
  bVar8 = uVar4 >= uVar2 && lVar5 != 0;
  if (uVar4 < uVar2 || lVar5 == 0) {
    lVar5 = 0;
  }
  else {
    std::vector<wasm::Type,std::allocator<wasm::Type>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)joinee,pTVar6,pTVar3,pTVar3 + lVar5)
    ;
  }
  pTVar3 = (joinee->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar6 = (joinee->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_start + lVar5;
  if ((pTVar3 != pTVar6) &&
     (pTVar7 = (joiner->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     pTVar7 != (joiner->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
               super__Vector_impl_data._M_start)) {
    do {
      pTVar7 = pTVar7 + -1;
      pTVar3 = pTVar3 + -1;
      bVar1 = ValType::meet((ValType *)this,pTVar3,(Element)pTVar7->id);
      bVar8 = (bool)(bVar1 | bVar8);
      if (pTVar3 == pTVar6) {
        return bVar8;
      }
    } while (pTVar7 != (joiner->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl
                       .super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    // If joiner is deeper than joinee, prepend those extra elements to joinee
    // first. They don't need to be explicitly joined with anything because they
    // would be joined with bottom, which wouldn't change them.
    bool result = false;
    size_t extraSize = 0;
    if (joiner.size() > joinee.size()) {
      extraSize = joiner.size() - joinee.size();
      auto extraBegin = joiner.begin();
      auto extraEnd = joiner.begin() + extraSize;
      joinee.insert(joinee.begin(), extraBegin, extraEnd);
      result = true;
    }
    // Join all the elements present in both materialized stacks, starting from
    // the end so the stack tops match up. Stop the iteration when we've
    // processed all of joinee, excluding any extra elements from joiner we just
    // prepended to it, or when we've processed all of joiner.
    auto joineeIt = joinee.rbegin();
    auto joinerIt = joiner.rbegin();
    auto joineeEnd = joinee.rend() - extraSize;
    for (; joineeIt != joineeEnd && joinerIt != joiner.rend();
         ++joineeIt, ++joinerIt) {
      result |= lattice.join(*joineeIt, *joinerIt);
    }
    return result;
  }